

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O1

void __thiscall cmSourceFile::CheckLanguage(cmSourceFile *this,string *ext)

{
  cmGlobalGenerator *this_00;
  string l;
  string local_30;
  
  this_00 = cmMakefile::GetGlobalGenerator((this->Location).Makefile);
  cmGlobalGenerator::GetLanguageFromExtension_abi_cxx11_(&local_30,this_00,(ext->_M_dataplus)._M_p);
  if (local_30._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this->Language);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmSourceFile::CheckLanguage(std::string const& ext)
{
  // Try to identify the source file language from the extension.
  cmMakefile const* mf = this->Location.GetMakefile();
  cmGlobalGenerator* gg = mf->GetGlobalGenerator();
  std::string l = gg->GetLanguageFromExtension(ext.c_str());
  if (!l.empty()) {
    this->Language = l;
  }
}